

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push_resampler.cc
# Opt level: O1

void __thiscall webrtc::PushResampler<short>::~PushResampler(PushResampler<short> *this)

{
  short *psVar1;
  PushSincResampler *pPVar2;
  
  this->_vptr_PushResampler = (_func_int **)&PTR__PushResampler_001cfbd0;
  psVar1 = (this->dst_right_)._M_t.super___uniq_ptr_impl<short,_std::default_delete<short[]>_>._M_t.
           super__Tuple_impl<0UL,_short_*,_std::default_delete<short[]>_>.
           super__Head_base<0UL,_short_*,_false>._M_head_impl;
  if (psVar1 != (short *)0x0) {
    operator_delete__(psVar1);
  }
  (this->dst_right_)._M_t.super___uniq_ptr_impl<short,_std::default_delete<short[]>_>._M_t.
  super__Tuple_impl<0UL,_short_*,_std::default_delete<short[]>_>.
  super__Head_base<0UL,_short_*,_false>._M_head_impl = (short *)0x0;
  psVar1 = (this->dst_left_)._M_t.super___uniq_ptr_impl<short,_std::default_delete<short[]>_>._M_t.
           super__Tuple_impl<0UL,_short_*,_std::default_delete<short[]>_>.
           super__Head_base<0UL,_short_*,_false>._M_head_impl;
  if (psVar1 != (short *)0x0) {
    operator_delete__(psVar1);
  }
  (this->dst_left_)._M_t.super___uniq_ptr_impl<short,_std::default_delete<short[]>_>._M_t.
  super__Tuple_impl<0UL,_short_*,_std::default_delete<short[]>_>.
  super__Head_base<0UL,_short_*,_false>._M_head_impl = (short *)0x0;
  psVar1 = (this->src_right_)._M_t.super___uniq_ptr_impl<short,_std::default_delete<short[]>_>._M_t.
           super__Tuple_impl<0UL,_short_*,_std::default_delete<short[]>_>.
           super__Head_base<0UL,_short_*,_false>._M_head_impl;
  if (psVar1 != (short *)0x0) {
    operator_delete__(psVar1);
  }
  (this->src_right_)._M_t.super___uniq_ptr_impl<short,_std::default_delete<short[]>_>._M_t.
  super__Tuple_impl<0UL,_short_*,_std::default_delete<short[]>_>.
  super__Head_base<0UL,_short_*,_false>._M_head_impl = (short *)0x0;
  psVar1 = (this->src_left_)._M_t.super___uniq_ptr_impl<short,_std::default_delete<short[]>_>._M_t.
           super__Tuple_impl<0UL,_short_*,_std::default_delete<short[]>_>.
           super__Head_base<0UL,_short_*,_false>._M_head_impl;
  if (psVar1 != (short *)0x0) {
    operator_delete__(psVar1);
  }
  (this->src_left_)._M_t.super___uniq_ptr_impl<short,_std::default_delete<short[]>_>._M_t.
  super__Tuple_impl<0UL,_short_*,_std::default_delete<short[]>_>.
  super__Head_base<0UL,_short_*,_false>._M_head_impl = (short *)0x0;
  pPVar2 = (this->sinc_resampler_right_)._M_t.
           super___uniq_ptr_impl<webrtc::PushSincResampler,_std::default_delete<webrtc::PushSincResampler>_>
           ._M_t.
           super__Tuple_impl<0UL,_webrtc::PushSincResampler_*,_std::default_delete<webrtc::PushSincResampler>_>
           .super__Head_base<0UL,_webrtc::PushSincResampler_*,_false>._M_head_impl;
  if (pPVar2 != (PushSincResampler *)0x0) {
    (*(pPVar2->super_SincResamplerCallback)._vptr_SincResamplerCallback[1])();
  }
  (this->sinc_resampler_right_)._M_t.
  super___uniq_ptr_impl<webrtc::PushSincResampler,_std::default_delete<webrtc::PushSincResampler>_>.
  _M_t.
  super__Tuple_impl<0UL,_webrtc::PushSincResampler_*,_std::default_delete<webrtc::PushSincResampler>_>
  .super__Head_base<0UL,_webrtc::PushSincResampler_*,_false>._M_head_impl = (PushSincResampler *)0x0
  ;
  pPVar2 = (this->sinc_resampler_)._M_t.
           super___uniq_ptr_impl<webrtc::PushSincResampler,_std::default_delete<webrtc::PushSincResampler>_>
           ._M_t.
           super__Tuple_impl<0UL,_webrtc::PushSincResampler_*,_std::default_delete<webrtc::PushSincResampler>_>
           .super__Head_base<0UL,_webrtc::PushSincResampler_*,_false>._M_head_impl;
  if (pPVar2 != (PushSincResampler *)0x0) {
    (*(pPVar2->super_SincResamplerCallback)._vptr_SincResamplerCallback[1])();
  }
  (this->sinc_resampler_)._M_t.
  super___uniq_ptr_impl<webrtc::PushSincResampler,_std::default_delete<webrtc::PushSincResampler>_>.
  _M_t.
  super__Tuple_impl<0UL,_webrtc::PushSincResampler_*,_std::default_delete<webrtc::PushSincResampler>_>
  .super__Head_base<0UL,_webrtc::PushSincResampler_*,_false>._M_head_impl = (PushSincResampler *)0x0
  ;
  return;
}

Assistant:

PushResampler<T>::~PushResampler() {
}